

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fApiCase.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::ApiCase::getSupportedExtensions
          (ApiCase *this,deUint32 numSupportedValues,deUint32 extension,
          vector<int,_std::allocator<int>_> *values)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  GLenum GVar1;
  deInt32 numFormats;
  int local_1ac;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  this_00 = &this->super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,numSupportedValues,&local_1ac);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar1,"glGetIntegerv(numSupportedValues, &numFormats)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fApiCase.cpp"
                  ,0x69);
  if ((long)local_1ac == 0) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_01 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"// No supported extensions available.",0x25);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    std::ios_base::~ios_base(local_130);
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize(values,(long)local_1ac);
    glu::CallLogWrapper::glGetIntegerv
              (this_00,extension,
               (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar1,"glGetIntegerv(extension, &values[0])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fApiCase.cpp"
                    ,0x70);
  }
  return;
}

Assistant:

void ApiCase::getSupportedExtensions (const deUint32 numSupportedValues, const deUint32 extension, std::vector<int>& values)
{
	deInt32 numFormats;
	GLU_CHECK_CALL(glGetIntegerv(numSupportedValues, &numFormats));
	if (numFormats == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "// No supported extensions available." << tcu::TestLog::EndMessage;
		return;
	}
	values.resize(numFormats);
	GLU_CHECK_CALL(glGetIntegerv(extension, &values[0]));
}